

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrFutureCompletionEXT *value)

{
  bool bVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  uint32_t in_stack_fffffffffffffd6c;
  string local_288;
  string local_268;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  if (value->type != XR_TYPE_FUTURE_COMPLETION_EXT) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrFutureCompletionEXT",value->type,
               "VUID-XrFutureCompletionEXT-type-type",XR_TYPE_FUTURE_COMPLETION_EXT,
               "XR_TYPE_FUTURE_COMPLETION_EXT");
  }
  if (!check_pnext) goto LAB_001ac981;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_288);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_288,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::string
              ((string *)&local_288,"VUID-XrFutureCompletionEXT-next-unique",
               (allocator *)&stack0xfffffffffffffd6e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_268,
               "Multiple structures of the same type(s) in \"next\" chain for XrFutureCompletionEXT struct"
               ,(allocator *)&stack0xfffffffffffffd6f);
    CoreValidLogMessage(instance_info,&local_288,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_288);
LAB_001ac94f:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrFutureCompletionEXT-next-next",
               (allocator *)&local_268);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_288,
               "Invalid structure(s) in \"next\" chain for XrFutureCompletionEXT struct \"next\"",
               (allocator *)&stack0xfffffffffffffd6e);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001ac94f;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001ac981:
  if (check_members && XVar3 == XR_SUCCESS) {
    std::__cxx11::string::string
              ((string *)&error_message,"XrFutureCompletionEXT",(allocator *)&local_268);
    std::__cxx11::string::string
              ((string *)&local_288,"futureResult",(allocator *)&valid_ext_structs);
    bVar1 = ValidateXrEnum(instance_info,command_name,&error_message,&local_288,objects_info,
                           value->futureResult);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_SUCCESS;
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrFutureCompletionEXT contains invalid XrResult \"futureResult\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd6c);
      std::operator<<((ostream *)&error_message,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::string
                ((string *)&local_288,"VUID-XrFutureCompletionEXT-futureResult-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_288,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      XVar3 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrFutureCompletionEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_FUTURE_COMPLETION_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrFutureCompletionEXT",
                             value->type, "VUID-XrFutureCompletionEXT-type-type", XR_TYPE_FUTURE_COMPLETION_EXT, "XR_TYPE_FUTURE_COMPLETION_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrFutureCompletionEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrFutureCompletionEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrFutureCompletionEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrFutureCompletionEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrFutureCompletionEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrResult value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrFutureCompletionEXT", "futureResult", objects_info, value->futureResult)) {
        std::ostringstream oss_enum;
        oss_enum << "XrFutureCompletionEXT contains invalid XrResult \"futureResult\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->futureResult));
        CoreValidLogMessage(instance_info, "VUID-XrFutureCompletionEXT-futureResult-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}